

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  bool bVar48;
  uint uVar49;
  int iVar50;
  int extraout_EAX;
  secp256k1_fe *psVar51;
  secp256k1_fe *psVar52;
  long lVar53;
  ulong uVar54;
  byte bVar55;
  int iVar56;
  secp256k1_fe *psVar57;
  ulong uVar58;
  uint64_t *t;
  secp256k1_fe *unaff_RBP;
  secp256k1_fe *psVar59;
  int iVar60;
  secp256k1_fe *in_RSI;
  ulong uVar61;
  secp256k1_fe *psVar62;
  uint64_t *puVar63;
  ulong uVar64;
  secp256k1_fe *psVar65;
  uint64_t *puVar66;
  secp256k1_fe *psVar67;
  int iVar68;
  secp256k1_fe *psVar69;
  secp256k1_fe *unaff_R12;
  secp256k1_fe *psVar70;
  long unaff_R13;
  secp256k1_fe *unaff_R14;
  secp256k1_fe *psVar71;
  secp256k1_fe *unaff_R15;
  bool bVar72;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 s;
  uchar auStack_270 [40];
  secp256k1_fe *psStack_248;
  secp256k1_fe *psStack_240;
  long lStack_238;
  secp256k1_fe *psStack_230;
  secp256k1_fe *psStack_228;
  secp256k1_fe *psStack_220;
  secp256k1_fe *psStack_210;
  ulong uStack_208;
  ulong uStack_200;
  ulong uStack_1f8;
  secp256k1_fe sStack_1f0;
  secp256k1_fe *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  long lStack_1b0;
  secp256k1_fe *psStack_1a8;
  secp256k1_fe *psStack_1a0;
  secp256k1_fe *psStack_198;
  undefined8 uStack_188;
  undefined1 auStack_180 [48];
  ulong uStack_150;
  secp256k1_fe *psStack_148;
  undefined1 auStack_140 [40];
  secp256k1_modinv64_trans2x2 sStack_118;
  secp256k1_fe *psStack_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_fe local_40;
  
  psVar62 = &local_c8;
  psVar70 = &local_c8;
  psVar57 = &local_c8;
  local_98.n[0] = x->n[0];
  local_98.n[1] = x->n[1];
  local_98.n[2] = x->n[2];
  local_98.n[3] = x->n[3];
  local_98.n[4] = x->n[4];
  local_98.magnitude = x->magnitude;
  local_98.normalized = x->normalized;
  secp256k1_fe_verify(x);
  local_c8.n[0] = x->n[0];
  local_c8.n[1] = x->n[1];
  local_c8.n[2] = x->n[2];
  local_c8.n[3] = x->n[3];
  local_c8.n[4] = x->n[4];
  local_c8.magnitude = x->magnitude;
  local_c8.normalized = x->normalized;
  secp256k1_fe_normalize_var(&local_c8);
  secp256k1_fe_verify(&local_c8);
  if (local_c8.normalized == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((local_c8.n[2] == 0 && local_c8.n[3] == 0) && (local_c8.n[1] == 0 && local_c8.n[0] == 0))
        && local_c8.n[4] == 0) {
      psVar57 = (secp256k1_fe *)0x1;
    }
    else {
      local_68.v[0] = (local_c8.n[1] << 0x34 | local_c8.n[0]) & 0x3fffffffffffffff;
      local_68.v[1] = (ulong)((uint)local_c8.n[2] & 0xfffff) << 0x2a | local_c8.n[1] >> 10;
      local_68.v[2] = (ulong)((uint)local_c8.n[3] & 0x3fffffff) << 0x20 | local_c8.n[2] >> 0x14;
      local_68.v[3] = (local_c8.n[4] & 0xffffffffff) << 0x16 | local_c8.n[3] >> 0x1e;
      local_68.v[4] = local_c8.n[4] >> 0x28;
      uVar49 = secp256k1_jacobi64_maybe_var(&local_68,&secp256k1_const_modinfo_fe);
      if (uVar49 == 0) {
        uVar49 = secp256k1_fe_sqrt(&local_40,&local_c8);
        psVar57 = (secp256k1_fe *)(ulong)uVar49;
      }
      else {
        psVar57 = (secp256k1_fe *)(ulong)(~uVar49 >> 0x1f);
      }
    }
    unaff_R14 = &local_98;
    secp256k1_fe_verify(unaff_R14);
    local_98.n[0] = (local_98.n[4] >> 0x30) * 0x1000003d1 + local_98.n[0];
    local_98.n[1] = (local_98.n[0] >> 0x34) + local_98.n[1];
    local_98.n[2] = (local_98.n[1] >> 0x34) + local_98.n[2];
    uVar61 = (local_98.n[2] >> 0x34) + local_98.n[3];
    local_98.n[3] = uVar61 & 0xfffffffffffff;
    local_98.n[4] = (uVar61 >> 0x34) + (local_98.n[4] & 0xffffffffffff);
    local_98.n[2] = local_98.n[2] & 0xfffffffffffff;
    local_98.n[1] = local_98.n[1] & 0xfffffffffffff;
    local_98.n[0] = local_98.n[0] & 0xfffffffffffff;
    local_98.magnitude = 1;
    secp256k1_fe_verify(unaff_R14);
    in_RSI = unaff_R14;
    iVar50 = secp256k1_fe_sqrt(&local_c8,unaff_R14);
    psVar62 = psVar70;
    if ((int)psVar57 == iVar50) {
      return (int)psVar57;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  psStack_f8 = psVar57;
  auStack_140._32_8_ = in_RSI->n[4];
  auStack_140._16_8_ = in_RSI->n[2];
  auStack_140._24_8_ = in_RSI->n[3];
  auStack_140._0_8_ = in_RSI->n[0];
  auStack_140._8_8_ = in_RSI->n[1];
  auStack_180._0_8_ = psVar62->n[0];
  auStack_180._8_8_ = psVar62->n[1];
  auStack_180._16_8_ = psVar62->n[2];
  auStack_180._24_8_ = psVar62->n[3];
  auStack_180._32_8_ = psVar62->n[4];
  if (((((long)auStack_180._0_8_ < 0) || ((long)auStack_180._8_8_ < 0)) ||
      (psVar57 = in_RSI, (long)auStack_180._16_8_ < 0)) ||
     ((psVar62 = (secp256k1_fe *)auStack_180._24_8_, (long)auStack_180._24_8_ < 0 ||
      ((long)auStack_180._32_8_ < 0)))) {
LAB_00153987:
    psStack_198 = (secp256k1_fe *)0x15398c;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_0015398c:
    psStack_198 = (secp256k1_fe *)0x153991;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00153991:
    psStack_198 = (secp256k1_fe *)0x153996;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_00153996:
    psStack_198 = (secp256k1_fe *)0x15399b;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_0015399b:
    psStack_198 = (secp256k1_fe *)0x1539a0;
    secp256k1_jacobi64_maybe_var_cold_8();
    in_RSI = psVar57;
    psVar70 = unaff_R12;
    psVar71 = unaff_R14;
  }
  else {
    psVar70 = unaff_R12;
    psVar71 = unaff_R14;
    if (((auStack_180._16_8_ != 0 || (secp256k1_fe *)auStack_180._24_8_ != (secp256k1_fe *)0x0) ||
        (auStack_180._8_8_ != 0 || auStack_180._0_8_ != 0)) || auStack_180._32_8_ != 0) {
      unaff_R14 = (secp256k1_fe *)0x5;
      unaff_R13 = -1;
      uStack_150 = 0;
      unaff_RBP = (secp256k1_fe *)0x0;
      auStack_180._40_8_ = in_RSI;
      do {
        psVar57 = (secp256k1_fe *)auStack_180._40_8_;
        psVar62 = (secp256k1_fe *)(auStack_140._8_8_ << 0x3e | auStack_140._0_8_);
        puVar63 = (uint64_t *)(auStack_180._8_8_ << 0x3e | auStack_180._0_8_);
        psVar51 = (secp256k1_fe *)0x0;
        psVar65 = (secp256k1_fe *)0x0;
        psVar70 = (secp256k1_fe *)0x1;
        iVar50 = 0x3e;
        psVar71 = (secp256k1_fe *)0x1;
        puVar66 = puVar63;
        psVar69 = psVar62;
        while( true ) {
          uVar61 = -1L << ((byte)iVar50 & 0x3f) | (ulong)puVar66;
          lVar53 = 0;
          if (uVar61 != 0) {
            for (; (uVar61 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
            }
          }
          bVar55 = (byte)lVar53;
          psVar67 = (secp256k1_fe *)((ulong)puVar66 >> (bVar55 & 0x3f));
          psVar71 = (secp256k1_fe *)((long)psVar71 << (bVar55 & 0x3f));
          psVar51 = (secp256k1_fe *)((long)psVar51 << (bVar55 & 0x3f));
          unaff_R13 = unaff_R13 - lVar53;
          uVar49 = ((uint)((ulong)psVar69 >> 1) ^ (uint)((ulong)psVar69 >> 2)) & (uint)lVar53 ^
                   (uint)unaff_RBP;
          unaff_R15 = (secp256k1_fe *)(ulong)uVar49;
          iVar50 = iVar50 - (uint)lVar53;
          psStack_148 = unaff_R14;
          if (iVar50 == 0) break;
          if (((ulong)psVar69 & 1) == 0) {
            psStack_198 = (secp256k1_fe *)0x153955;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00153955:
            psStack_198 = (secp256k1_fe *)0x15395a;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_0015395a:
            psStack_198 = (secp256k1_fe *)0x15395f;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_0015395f:
            psStack_198 = (secp256k1_fe *)0x153964;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00153964;
          }
          if (((ulong)psVar67 & 1) == 0) goto LAB_00153955;
          bVar55 = 0x3e - (char)iVar50;
          in_RSI = (secp256k1_fe *)((long)psVar69 << (bVar55 & 0x3f));
          if ((secp256k1_fe *)((long)psVar51 * (long)puVar63 + (long)psVar71 * (long)psVar62) !=
              in_RSI) goto LAB_0015395a;
          in_RSI = (secp256k1_fe *)((long)psVar70 * (long)puVar63 + (long)psVar65 * (long)psVar62);
          if (in_RSI != (secp256k1_fe *)((long)psVar67 << (bVar55 & 0x3f))) goto LAB_0015395f;
          iVar68 = (int)psVar69;
          iVar60 = (int)psVar67;
          if (unaff_R13 < 0) {
            unaff_R13 = -unaff_R13;
            iVar56 = (int)unaff_R13 + 1;
            if (iVar50 <= iVar56) {
              iVar56 = iVar50;
            }
            if (0xffffffc1 < iVar56 - 0x3fU) {
              unaff_RBP = (secp256k1_fe *)
                          (ulong)(uVar49 ^ (uint)(((ulong)psVar67 & (ulong)psVar69) >> 1));
              in_RSI = (secp256k1_fe *)
                       ((ulong)(0x3fL << (-(char)iVar56 & 0x3fU)) >> (-(char)iVar56 & 0x3fU));
              uVar49 = (iVar60 * iVar60 + 0x3e) * iVar60 * iVar68 & (uint)in_RSI;
              psVar52 = psVar51;
              psVar51 = psVar70;
              psVar59 = psVar67;
              psVar70 = psVar71;
              psVar71 = psVar65;
              goto LAB_0015373f;
            }
            goto LAB_0015396e;
          }
          iVar56 = (int)unaff_R13 + 1;
          if (iVar50 <= iVar56) {
            iVar56 = iVar50;
          }
          if (iVar56 - 0x3fU < 0xffffffc2) goto LAB_00153969;
          in_RSI = (secp256k1_fe *)
                   ((ulong)(0xfL << (-(char)iVar56 & 0x3fU)) >> (-(char)iVar56 & 0x3fU));
          uVar49 = -(iVar60 * ((iVar68 * 2 + 2U & 8) + iVar68)) & (uint)in_RSI;
          psVar52 = psVar70;
          psVar59 = psVar69;
          psVar70 = psVar65;
          psVar69 = psVar67;
          unaff_RBP = unaff_R15;
LAB_0015373f:
          uVar61 = (ulong)uVar49;
          puVar66 = (uint64_t *)((long)psVar69->n + uVar61 * (long)psVar59);
          psVar65 = (secp256k1_fe *)((long)psVar70->n + (long)psVar71 * uVar61);
          psVar70 = (secp256k1_fe *)((long)psVar52->n + uVar61 * (long)psVar51);
          psVar69 = psVar59;
          unaff_R15 = unaff_RBP;
          if (((ulong)puVar66 & (ulong)in_RSI) != 0) {
LAB_00153964:
            psStack_198 = (secp256k1_fe *)0x153969;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00153969:
            psStack_198 = (secp256k1_fe *)0x15396e;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_0015396e:
            psStack_198 = (secp256k1_fe *)0x153973;
            secp256k1_jacobi64_maybe_var_cold_5();
            psVar57 = in_RSI;
            unaff_R12 = psVar70;
            unaff_R14 = psVar71;
            goto LAB_00153973;
          }
        }
        psVar62 = SUB168(SEXT816((long)psVar51) * SEXT816((long)psVar65),8);
        lVar53 = (long)psVar71 * (long)psVar70 - (long)psVar51 * (long)psVar65;
        uVar61 = (ulong)((ulong)((long)psVar71 * (long)psVar70) <
                        (ulong)((long)psVar51 * (long)psVar65));
        uVar64 = SUB168(SEXT816((long)psVar71) * SEXT816((long)psVar70),8) - (long)psVar62;
        unaff_RBP = (secp256k1_fe *)auStack_180;
        sStack_118.u = (int64_t)psVar71;
        sStack_118.v = (int64_t)psVar51;
        sStack_118.q = (int64_t)psVar65;
        sStack_118.r = (int64_t)psVar70;
        if ((uVar64 - uVar61 != -1 || lVar53 != -0x4000000000000000) &&
           (lVar53 != 0x4000000000000000 || uVar64 != uVar61)) goto LAB_001539a5;
        unaff_R12 = (secp256k1_fe *)auStack_140;
        iVar60 = (int)unaff_R14;
        psStack_198 = (secp256k1_fe *)0x1537ed;
        psVar62 = unaff_R12;
        iVar50 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)unaff_R12,iVar60,
                            (secp256k1_modinv64_signed62 *)auStack_180._40_8_,0);
        if (iVar50 < 1) {
LAB_00153973:
          psStack_198 = (secp256k1_fe *)0x153978;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00153978:
          psStack_198 = (secp256k1_fe *)0x15397d;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_0015397d:
          psStack_198 = (secp256k1_fe *)0x153982;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00153982:
          psStack_198 = (secp256k1_fe *)0x153987;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_00153987;
        }
        psStack_198 = (secp256k1_fe *)0x153808;
        psVar62 = unaff_R12;
        iVar50 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)unaff_R12,iVar60,
                            (secp256k1_modinv64_signed62 *)psVar57,1);
        if (0 < iVar50) goto LAB_00153978;
        psStack_198 = (secp256k1_fe *)0x153820;
        psVar62 = unaff_RBP;
        iVar50 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar60,
                            (secp256k1_modinv64_signed62 *)psVar57,0);
        if (iVar50 < 1) goto LAB_0015397d;
        psStack_198 = (secp256k1_fe *)0x15383b;
        psVar62 = unaff_RBP;
        iVar50 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar60,
                            (secp256k1_modinv64_signed62 *)psVar57,1);
        if (-1 < iVar50) goto LAB_00153982;
        psStack_198 = (secp256k1_fe *)0x153856;
        secp256k1_modinv64_update_fg_62_var
                  (iVar60,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)unaff_RBP,&sStack_118);
        if (auStack_140._0_8_ == 1) {
          if (1 < iVar60) {
            psVar62 = (secp256k1_fe *)0x1;
            uVar61 = 0;
            do {
              uVar61 = uVar61 | *(ulong *)(auStack_140 + (long)psVar62 * 8);
              psVar62 = (secp256k1_fe *)((long)psVar62->n + 1);
            } while (unaff_R14 != psVar62);
            if (uVar61 != 0) goto LAB_00153888;
          }
          uStack_188._4_4_ = 1 - (uVar49 * 2 & 2);
          bVar4 = false;
        }
        else {
LAB_00153888:
          lVar53 = (long)iVar60;
          if ((-1 < lVar53 + -2 && (&psStack_148)[lVar53] == (secp256k1_fe *)0x0) &&
              (&uStack_188)[lVar53] == 0) {
            unaff_R14 = (secp256k1_fe *)(ulong)(iVar60 - 1);
          }
          psStack_198 = (secp256k1_fe *)0x1538b5;
          iVar60 = (int)unaff_R14;
          psVar62 = unaff_R12;
          iVar50 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)unaff_R12,iVar60,
                              (secp256k1_modinv64_signed62 *)psVar57,0);
          if (iVar50 < 1) goto LAB_0015398c;
          psStack_198 = (secp256k1_fe *)0x1538d0;
          psVar62 = unaff_R12;
          iVar50 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)unaff_R12,iVar60,
                              (secp256k1_modinv64_signed62 *)psVar57,1);
          if (0 < iVar50) goto LAB_00153991;
          psStack_198 = (secp256k1_fe *)0x1538e8;
          psVar62 = unaff_RBP;
          iVar50 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar60,
                              (secp256k1_modinv64_signed62 *)psVar57,0);
          if (iVar50 < 1) goto LAB_00153996;
          psStack_198 = (secp256k1_fe *)0x153903;
          psVar62 = unaff_RBP;
          iVar50 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar60,
                              (secp256k1_modinv64_signed62 *)psVar57,1);
          bVar4 = true;
          if (-1 < iVar50) goto LAB_0015399b;
        }
        if (!bVar4) {
          return uStack_188._4_4_;
        }
        uVar49 = (int)uStack_150 + 1;
        uStack_150 = (ulong)uVar49;
        in_RSI = psVar57;
        unaff_RBP = unaff_R15;
        if (uVar49 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  psStack_198 = (secp256k1_fe *)0x1539a5;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_001539a5:
  psStack_198 = (secp256k1_fe *)secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_220 = (secp256k1_fe *)0x1539c0;
  psVar57 = psVar62;
  psStack_1c0 = in_RSI;
  psStack_1b8 = psVar70;
  lStack_1b0 = unaff_R13;
  psStack_1a8 = psVar71;
  psStack_1a0 = unaff_R15;
  psStack_198 = unaff_RBP;
  secp256k1_fe_verify(psVar62);
  if (psVar62->magnitude < 9) {
    uVar61 = psVar62->n[0];
    uVar64 = psVar62->n[1];
    uVar1 = psVar62->n[2];
    uVar2 = psVar62->n[3];
    uVar3 = psVar62->n[4];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar61 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar64 * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar3;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    uVar54 = SUB168(auVar7 * auVar27,0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar54 & 0xfffffffffffff;
    auVar5 = auVar6 * auVar26 + auVar5 * auVar25 + auVar8 * ZEXT816(0x1000003d10);
    uVar58 = auVar5._0_8_;
    uStack_1f8 = uVar58 & 0xfffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar58 >> 0x34 | auVar5._8_8_ << 0xc;
    uVar3 = uVar3 * 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar61;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar3;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar64 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar2;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar1;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar54 >> 0x34 | SUB168(auVar7 * auVar27,8) << 0xc;
    auVar5 = auVar9 * auVar28 + auVar41 + auVar10 * auVar29 + auVar11 * auVar30 +
             auVar12 * ZEXT816(0x1000003d10);
    uStack_200 = auVar5._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uStack_200 >> 0x34 | auVar5._8_8_ << 0xc;
    uStack_208 = (uStack_200 & 0xfffffffffffff) >> 0x30;
    uStack_200 = uStack_200 & 0xffffffffffff;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar61;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar61;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar64;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar3;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar1 * 2;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar2;
    auVar5 = auVar14 * auVar32 + auVar42 + auVar15 * auVar33;
    uVar54 = auVar5._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar54 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (uVar54 & 0xfffffffffffff) << 4 | uStack_208;
    auVar5 = auVar13 * auVar31 + ZEXT816(0x1000003d1) * auVar34;
    uVar54 = auVar5._0_8_;
    sStack_1f0.n[0] = uVar54 & 0xfffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar54 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar61 * 2;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar64;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar1;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar3;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar2;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar2;
    auVar6 = auVar17 * auVar36 + auVar44 + auVar18 * auVar37;
    uVar54 = auVar6._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar54 & 0xfffffffffffff;
    auVar5 = auVar16 * auVar35 + auVar43 + auVar19 * ZEXT816(0x1000003d10);
    uVar58 = auVar5._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar54 >> 0x34 | auVar6._8_8_ << 0xc;
    sStack_1f0.n[1] = uVar58 & 0xfffffffffffff;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar58 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar61 * 2;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar1;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar64;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar64;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar2;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar3;
    auVar46 = auVar22 * auVar40 + auVar46;
    uVar61 = auVar46._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar61 & 0xfffffffffffff;
    auVar5 = auVar20 * auVar38 + auVar45 + auVar21 * auVar39 + auVar23 * ZEXT816(0x1000003d10);
    uVar64 = auVar5._0_8_;
    sStack_1f0.n[2] = uVar64 & 0xfffffffffffff;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = (uVar64 >> 0x34 | auVar5._8_8_ << 0xc) + uStack_1f8;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar61 >> 0x34 | auVar46._8_8_ << 0xc;
    auVar47 = auVar24 * ZEXT816(0x1000003d10) + auVar47;
    uVar61 = auVar47._0_8_;
    sStack_1f0.n[3] = uVar61 & 0xfffffffffffff;
    sStack_1f0.n[4] = (uVar61 >> 0x34 | auVar47._8_8_ << 0xc) + uStack_200;
    sStack_1f0.magnitude = 1;
    sStack_1f0.normalized = 0;
    psStack_220 = (secp256k1_fe *)0x153c0c;
    psStack_210 = psVar62;
    secp256k1_fe_verify(&sStack_1f0);
    psStack_220 = (secp256k1_fe *)0x153c1c;
    secp256k1_fe_mul(&sStack_1f0,&sStack_1f0,psStack_210);
    psStack_220 = (secp256k1_fe *)0x153c24;
    secp256k1_fe_verify(&sStack_1f0);
    sStack_1f0.n[0] = sStack_1f0.n[0] + 7;
    sStack_1f0.normalized = 0;
    sStack_1f0.magnitude = sStack_1f0.magnitude + 1;
    psStack_220 = (secp256k1_fe *)0x153c3b;
    secp256k1_fe_verify(&sStack_1f0);
    psStack_220 = (secp256k1_fe *)0x153c43;
    iVar50 = secp256k1_fe_is_square_var(&sStack_1f0);
    return iVar50;
  }
  psStack_220 = (secp256k1_fe *)random_fe_test;
  secp256k1_ge_x_on_curve_var_cold_1();
  psStack_248 = psVar62;
  psStack_240 = psVar70;
  lStack_238 = unaff_R13;
  psStack_230 = psVar71;
  psStack_228 = unaff_R15;
  psStack_220 = unaff_RBP;
  do {
    secp256k1_testrand_bytes_test(auStack_270,0x20);
    secp256k1_fe_impl_set_b32_mod(psVar57,auStack_270);
    uVar61 = psVar57->n[4] ^ 0xffffffffffff;
    bVar48 = (psVar57->n[2] & psVar57->n[3] & psVar57->n[1]) == 0xfffffffffffff;
    bVar72 = bVar48 && uVar61 == 0;
    iVar50 = (int)CONCAT71((int7)(uVar61 >> 8),bVar72);
    bVar4 = 0xffffefffffc2e < psVar57->n[0];
    if (bVar4 && (bVar48 && uVar61 == 0)) {
      psVar57->magnitude = -1;
    }
    else {
      psVar57->magnitude = 1;
      psVar57->normalized = 1;
      secp256k1_fe_verify(psVar57);
      iVar50 = extraout_EAX;
    }
  } while (bVar4 && bVar72);
  return iVar50;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    secp256k1_fe_verify(x);
    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}